

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O3

void overwrite_data(string *filename,Elf64_Off offset,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string data;
  ofstream file;
  long *local_240 [2];
  long local_230 [2];
  long local_220;
  filebuf local_218 [24];
  byte abStack_200 [216];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)filename,_S_out|_S_in|_S_bin);
  if ((abStack_200[*(long *)(local_220 + -0x18)] & 5) == 0) {
    local_240[0] = local_230;
    std::__cxx11::string::_M_construct((ulong)local_240,(char)str->_M_string_length);
    std::ostream::seekp(&local_220,offset,0);
    std::ostream::write((char *)&local_220,(long)local_240[0]);
    if (local_240[0] != local_230) {
      operator_delete(local_240[0],local_230[0] + 1);
    }
    local_220 = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_218);
    std::ios_base::~ios_base(local_128);
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(__return_storage_ptr__,"Error opening file",filename);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void overwrite_data( const std::string& filename,
                     Elf64_Off          offset,
                     const std::string& str )
{
    std::ofstream file( filename,
                        std::ios::in | std::ios::out | std::ios::binary );
    if ( !file )
        throw "Error opening file" + filename;
    std::string data( str.length(), '-' );
    file.seekp( (std::streampos)offset );
    file.write( data.c_str(), data.length() + 1 );
}